

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O0

char * zmq::mechanism_t::socket_type_string(int socket_type_)

{
  uint in_EDI;
  
  if (0x14 < in_EDI) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "socket_type_ >= 0 && socket_type_ < static_cast<int> (names_count)",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/mechanism.cpp"
            ,0x77);
    fflush(_stderr);
    zmq_abort((char *)0x314ea1);
  }
  return socket_type_string::names[(int)in_EDI];
}

Assistant:

const char *zmq::mechanism_t::socket_type_string (int socket_type_)
{
    // TODO the order must of the names must correspond to the values resp. order of ZMQ_* socket type definitions in zmq.h!
    static const char *names[] = {socket_type_pair,   socket_type_pub,
                                  socket_type_sub,    socket_type_req,
                                  socket_type_rep,    socket_type_dealer,
                                  socket_type_router, socket_type_pull,
                                  socket_type_push,   socket_type_xpub,
                                  socket_type_xsub,   socket_type_stream,
#ifdef ZMQ_BUILD_DRAFT_API
                                  socket_type_server, socket_type_client,
                                  socket_type_radio,  socket_type_dish,
                                  socket_type_gather, socket_type_scatter,
                                  socket_type_dgram,  socket_type_peer,
                                  socket_type_channel
#endif
    };
    static const size_t names_count = sizeof (names) / sizeof (names[0]);
    zmq_assert (socket_type_ >= 0
                && socket_type_ < static_cast<int> (names_count));
    return names[socket_type_];
}